

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O0

int E_Stem(int type,int si1,int sj1,int extLoop,vrna_param_t *P)

{
  int local_34;
  int local_30;
  int d3;
  int d5;
  int energy;
  vrna_param_t *P_local;
  int extLoop_local;
  int sj1_local;
  int si1_local;
  int type_local;
  
  d3 = 0;
  if (si1 < 0) {
    local_30 = 0;
  }
  else {
    local_30 = P->dangle5[type][si1];
  }
  if (sj1 < 0) {
    local_34 = 0;
  }
  else {
    local_34 = P->dangle3[type][sj1];
  }
  if (2 < type) {
    d3 = P->TerminalAU;
  }
  if ((si1 < 0) || (sj1 < 0)) {
    local_30 = local_30 + local_34;
  }
  else if (extLoop == 0) {
    local_30 = P->mismatchM[type][si1][sj1];
  }
  else {
    local_30 = P->mismatchExt[type][si1][sj1];
  }
  d3 = local_30 + d3;
  if (extLoop == 0) {
    d3 = P->MLintern[type] + d3;
  }
  return d3;
}

Assistant:

PUBLIC int
E_Stem(int          type,
       int          si1,
       int          sj1,
       int          extLoop,
       vrna_param_t *P)
{
  int energy  = 0;
  int d5      = (si1 >= 0) ? P->dangle5[type][si1] : 0;
  int d3      = (sj1 >= 0) ? P->dangle3[type][sj1] : 0;

  if (type > 2)
    energy += P->TerminalAU;

  if (si1 >= 0 && sj1 >= 0)
    energy += (extLoop) ? P->mismatchExt[type][si1][sj1] : P->mismatchM[type][si1][sj1];
  else
    energy += d5 + d3;

  if (!extLoop)
    energy += P->MLintern[type];

  return energy;
}